

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::dumpProgramBuildLog
          (CLIntercept *this,cl_program program,cl_device_id device,char *buildLog,
          size_t buildLogSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  mapped_type *pmVar5;
  double __x;
  cl_device_type deviceType;
  string fileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  cl_program program_local;
  char numberString [256];
  
  program_local = program;
  pmVar5 = std::
           map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
           ::operator[](&this->m_ProgramInfoMap,&program_local);
  fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
  fileName._M_string_length = 0;
  fileName.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)numberString,sc_DumpDirectoryName,(allocator *)&local_160);
  OS::Services_Common::GetDumpDirectoryName
            (&(this->m_OS).super_Services_Common,(string *)numberString,&fileName);
  std::__cxx11::string::~string((string *)numberString);
  memset(numberString,0,0x100);
  if ((this->m_Config).OmitProgramNumber == true) {
    uVar1 = pmVar5->CompileCount;
    uVar2 = (uint)pmVar5->ProgramHash;
    uVar3 = (uint)pmVar5->OptionsHash;
    pcVar4 = "$%08X_%04u_%08X";
  }
  else {
    uVar1 = (uint)pmVar5->ProgramHash;
    uVar2 = pmVar5->ProgramNumber;
    uVar3 = pmVar5->CompileCount;
    pcVar4 = "$%04u_%08X_%04u_%08X";
  }
  snprintf(numberString,0x100,pcVar4 + 1,(ulong)uVar2,(ulong)uVar1,(ulong)uVar3);
  std::__cxx11::string::append((char *)&fileName);
  std::__cxx11::string::append((char *)&fileName);
  OS::Services_Common::MakeDumpDirectories(&(this->m_OS).super_Services_Common,&fileName);
  deviceType = 1;
  (*(this->m_Dispatch).clGetDeviceInfo)(device,0x1000,8,&deviceType,(size_t *)0x0);
  if ((deviceType & 2) != 0) {
    std::__cxx11::string::append((char *)&fileName);
  }
  if ((deviceType & 4) != 0) {
    std::__cxx11::string::append((char *)&fileName);
  }
  if ((deviceType & 8) != 0) {
    std::__cxx11::string::append((char *)&fileName);
  }
  if ((deviceType & 0x10) != 0) {
    std::__cxx11::string::append((char *)&fileName);
  }
  std::__cxx11::string::append((char *)&fileName);
  std::operator+(&local_160,"Dumping build log to file: ",&fileName);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)numberString,
                 &local_160,"\n");
  log(this,__x);
  std::__cxx11::string::~string((string *)numberString);
  std::__cxx11::string::~string((string *)&local_160);
  dumpMemoryToFile(this,&fileName,false,buildLog,buildLogSize);
  std::__cxx11::string::~string((string *)&fileName);
  return;
}

Assistant:

void CLIntercept::dumpProgramBuildLog(
    const cl_program program,
    const cl_device_id device,
    const char* buildLog,
    const size_t buildLogSize )
{
    // We're already in a critical section when we get here, so we don't need to
    // grab the critical section again.

    CLI_ASSERT( config().DumpProgramBuildLogs );
    CLI_ASSERT( buildLog );

    const SProgramInfo& programInfo = m_ProgramInfoMap[ program ];

    std::string fileName;

    // Get the dump directory name.
    {
        OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
    }
    // Make the file name.  It will have the form:
    //   CLI_<program number>_<program hash>_<compile count>_<options hash>
    // Leave off the extension for now.
    {
        char    numberString[256] = "";

        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( numberString, 256, "%08X_%04u_%08X",
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }
        else
        {
            CLI_SPRINTF( numberString, 256, "%04u_%08X_%04u_%08X",
                programInfo.ProgramNumber,
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }

        fileName += "/CLI_";
        fileName += numberString;
    }
    // Now make directories as appropriate.
    {
        OS().MakeDumpDirectories( fileName );
    }

    cl_device_type  deviceType = CL_DEVICE_TYPE_DEFAULT;

    // It's OK if this fails.  If it does, it just
    // means that our output file won't have a device
    // type.
    dispatch().clGetDeviceInfo(
        device,
        CL_DEVICE_TYPE,
        sizeof( deviceType ),
        &deviceType,
        NULL );

    if( deviceType & CL_DEVICE_TYPE_CPU )
    {
        fileName += "_CPU";
    }
    if( deviceType & CL_DEVICE_TYPE_GPU )
    {
        fileName += "_GPU";
    }
    if( deviceType & CL_DEVICE_TYPE_ACCELERATOR )
    {
        fileName += "_ACC";
    }
    if( deviceType & CL_DEVICE_TYPE_CUSTOM )
    {
        fileName += "_CUSTOM";
    }

    fileName += "_build_log.txt";

    log( "Dumping build log to file: " + fileName + "\n" );
    dumpMemoryToFile(
        fileName,
        false,
        buildLog,
        buildLogSize );
}